

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::initCharAttributes
               (QStringView string,ScriptItem *items,qsizetype numItems,QCharAttributes *attributes,
               CharAttributeOptions options)

{
  bool bVar1;
  QFlagsStorage<QUnicodeTools::CharAttributeOption> QVar2;
  QFlagsStorage<QUnicodeTools::CharAttributeOption> QVar3;
  QFlagsStorage<QUnicodeTools::CharAttributeOption> QVar4;
  qsizetype qVar5;
  QCharAttributes *attributes_00;
  qsizetype in_RCX;
  QCharAttributes *in_RDX;
  ScriptItem *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QCharAttributes *in_stack_00000060;
  undefined4 in_stack_00000068;
  CharAttributeOptions in_stack_000000ac;
  undefined8 in_stack_ffffffffffffff78;
  CharAttributeOption other;
  QFlags<QUnicodeTools::CharAttributeOption> *in_stack_ffffffffffffff80;
  storage_type_conflict *in_stack_ffffffffffffff88;
  storage_type_conflict *in_stack_ffffffffffffff90;
  QCharAttributes *in_stack_ffffffffffffffa0;
  ScriptItem *in_stack_ffffffffffffffa8;
  ScriptItem *pSVar6;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QStringView local_18;
  long local_8;
  
  other = (CharAttributeOption)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = QStringView::size(&local_18);
  if (0 < qVar5) {
    QVar2.i = (Int)QFlags<QUnicodeTools::CharAttributeOption>::operator&
                             (in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffe0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pSVar6 = in_R8;
      qVar5 = QStringView::size(&local_18);
      memset(in_R8,0,qVar5 + 1);
      in_stack_ffffffffffffffa8 = in_R8;
      in_R8 = pSVar6;
    }
    QVar3.i = (Int)QFlags<QUnicodeTools::CharAttributeOption>::operator&
                             (in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffdc);
    if (bVar1) {
      in_stack_ffffffffffffffa0 = (QCharAttributes *)QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      getGraphemeBreaks((char16_t *)in_RDX,in_RCX,(QCharAttributes *)in_R8);
    }
    QVar4.i = (Int)QFlags<QUnicodeTools::CharAttributeOption>::operator&
                             (in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffd8);
    if (bVar1) {
      QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      getWordBreaks((char16_t *)CONCAT44(in_R9D,QVar2.i),CONCAT44(QVar3.i,QVar4.i),
                    (QCharAttributes *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                   );
    }
    QVar2.i = (Int)QFlags<QUnicodeTools::CharAttributeOption>::operator&
                             (in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffd4);
    if (bVar1) {
      in_stack_ffffffffffffff90 = QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      getSentenceBreaks((char16_t *)CONCAT44(QVar2.i,in_stack_ffffffffffffffd0),
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDX);
    }
    QFlags<QUnicodeTools::CharAttributeOption>::operator&(in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffd0);
    if (bVar1) {
      in_stack_ffffffffffffff88 = QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      getLineBreaks((char16_t *)string.m_size,
                    CONCAT44(options.
                             super_QFlagsStorageHelper<QUnicodeTools::CharAttributeOption,_4>.
                             super_QFlagsStorage<QUnicodeTools::CharAttributeOption>.i,
                             in_stack_00000068),in_stack_00000060,in_stack_000000ac);
    }
    QFlags<QUnicodeTools::CharAttributeOption>::operator&(in_stack_ffffffffffffff80,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffc8);
    if (bVar1) {
      attributes_00 = (QCharAttributes *)QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      getWhiteSpaces(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88,attributes_00);
    }
    if ((in_RDX != (QCharAttributes *)0x0) && (0 < in_RCX)) {
      QStringView::utf16(&local_18);
      QStringView::size(&local_18);
      Tailored::getCharAttributes
                ((char16_t *)in_RDX,in_RCX,in_R8,(qsizetype)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void initCharAttributes(QStringView string,
                                      const ScriptItem *items, qsizetype numItems,
                                      QCharAttributes *attributes, CharAttributeOptions options)
{
    if (string.size() <= 0)
        return;

    if (!(options & DontClearAttributes))
        ::memset(attributes, 0, (string.size() + 1) * sizeof(QCharAttributes));

    if (options & GraphemeBreaks)
        getGraphemeBreaks(string.utf16(), string.size(), attributes);
    if (options & WordBreaks)
        getWordBreaks(string.utf16(), string.size(), attributes);
    if (options & SentenceBreaks)
        getSentenceBreaks(string.utf16(), string.size(), attributes);
    if (options & LineBreaks)
        getLineBreaks(string.utf16(), string.size(), attributes, options);
    if (options & WhiteSpaces)
        getWhiteSpaces(string.utf16(), string.size(), attributes);

    if (!qt_initcharattributes_default_algorithm_only) {
        if (!items || numItems <= 0)
            return;

        Tailored::getCharAttributes(string.utf16(), string.size(), items, numItems, attributes);
    }
}